

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkMerge.c
# Opt level: O0

void Nwk_ManGraphHashEdge(Nwk_Grf_t *p,int iLut1,int iLut2)

{
  Nwk_Edg_t *pNVar1;
  uint uVar2;
  Nwk_Edg_t *pNStack_20;
  uint Key;
  Nwk_Edg_t *pEntry;
  int iLut2_local;
  int iLut1_local;
  Nwk_Grf_t *p_local;
  
  if (iLut1 != iLut2) {
    pEntry._0_4_ = iLut2;
    pEntry._4_4_ = iLut1;
    if (iLut2 < iLut1) {
      pEntry._0_4_ = iLut1;
      pEntry._4_4_ = iLut2;
    }
    if ((int)pEntry <= pEntry._4_4_) {
      __assert_fail("iLut1 < iLut2",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/nwk/nwkMerge.c"
                    ,0x83,"void Nwk_ManGraphHashEdge(Nwk_Grf_t *, int, int)");
    }
    if (p->nObjs < (int)pEntry) {
      p->nObjs = (int)pEntry;
    }
    uVar2 = (uint)(pEntry._4_4_ * 0xb5051 + (int)pEntry * 0x40f1f9) % (uint)p->nEdgeHash;
    for (pNStack_20 = p->pEdgeHash[uVar2]; pNStack_20 != (Nwk_Edg_t *)0x0;
        pNStack_20 = pNStack_20->pNext) {
      if ((pNStack_20->iNode1 == pEntry._4_4_) && (pNStack_20->iNode2 == (int)pEntry)) {
        return;
      }
    }
    pNVar1 = (Nwk_Edg_t *)Aig_MmFixedEntryFetch(p->pMemEdges);
    pNVar1->iNode1 = pEntry._4_4_;
    pNVar1->iNode2 = (int)pEntry;
    pNVar1->pNext = p->pEdgeHash[uVar2];
    p->pEdgeHash[uVar2] = pNVar1;
    p->nEdges = p->nEdges + 1;
  }
  return;
}

Assistant:

void Nwk_ManGraphHashEdge( Nwk_Grf_t * p, int iLut1, int iLut2 )
{
    Nwk_Edg_t * pEntry;
    unsigned Key;
    if ( iLut1 == iLut2 )
        return;
    if ( iLut1 > iLut2 )
    {
        Key = iLut1;
        iLut1 = iLut2;
        iLut2 = Key;
    }
    assert( iLut1 < iLut2 );
    if ( p->nObjs < iLut2 )
        p->nObjs = iLut2;
    Key = (unsigned)(741457 * iLut1 + 4256249 * iLut2) % p->nEdgeHash;
    for ( pEntry = p->pEdgeHash[Key]; pEntry; pEntry = pEntry->pNext )
        if ( pEntry->iNode1 == iLut1 && pEntry->iNode2 == iLut2 )
            return;
    pEntry = (Nwk_Edg_t *)Aig_MmFixedEntryFetch( p->pMemEdges );
    pEntry->iNode1 = iLut1;
    pEntry->iNode2 = iLut2;
    pEntry->pNext = p->pEdgeHash[Key];
    p->pEdgeHash[Key] = pEntry;
    p->nEdges++;
}